

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_brusselator_mri.c
# Opt level: O1

int main(void)

{
  undefined8 *puVar1;
  uint uVar2;
  long *plVar3;
  FILE *__s;
  char *pcVar4;
  int iVar5;
  double dVar6;
  void *inner_arkode_mem;
  void *arkode_mem;
  SUNContext ctx;
  MRIStepInnerStepper inner_stepper;
  sunrealtype t;
  long nff;
  long nfse;
  long nstf;
  long nsts;
  long local_98;
  long local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  double local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  local_90 = 0;
  local_98 = 0;
  local_80 = 0;
  uVar2 = SUNContext_Create(0,&local_88);
  if ((int)uVar2 < 0) {
    pcVar4 = "SUNContext_Create";
    goto LAB_0010178f;
  }
  puts("\nBrusselator ODE test problem:");
  printf("    initial conditions:  u0 = %g,  v0 = %g,  w0 = %g\n",0x3ff3333333333333,
         0x4008cccccccccccd,0x4008000000000000);
  printf("    problem parameters:  a = %g,  b = %g,  ep = %g\n",0x3ff0000000000000,
         0x400c000000000000,0x3f847ae147ae147b);
  printf("    hs = %g,  hf = %g\n\n",0x3f9999999999999a,0x3f50624dd2f1a9fc);
  local_48 = 0x3ff0000000000000;
  uStack_40 = 0x400c000000000000;
  local_38 = 0x3f847ae147ae147b;
  plVar3 = (long *)N_VNew_Serial(3,local_88);
  if (plVar3 == (long *)0x0) {
    main_cold_3();
    return 1;
  }
  puVar1 = *(undefined8 **)(*plVar3 + 0x10);
  *puVar1 = 0x3ff3333333333333;
  puVar1[1] = 0x4008cccccccccccd;
  puVar1[2] = 0x4008000000000000;
  local_98 = ARKStepCreate(0,ff,0,plVar3,local_88);
  if (local_98 == 0) {
    main_cold_2();
    return 1;
  }
  uVar2 = ARKodeSetUserData(local_98,&local_48);
  if ((int)uVar2 < 0) {
LAB_00101701:
    pcVar4 = "ARKodeSetUserData";
  }
  else {
    uVar2 = ARKStepSetTableNum(local_98,0xffffffff,0xc);
    if ((int)uVar2 < 0) {
      pcVar4 = "ARKStepSetTableNum";
      goto LAB_0010178f;
    }
    uVar2 = ARKodeSetFixedStep(0x3f50624dd2f1a9fc,local_98);
    if (-1 < (int)uVar2) {
      uVar2 = ARKodeCreateMRIStepInnerStepper(local_98,&local_80);
      if ((int)uVar2 < 0) {
        pcVar4 = "ARKodeCreateMRIStepInnerStepper";
        goto LAB_0010178f;
      }
      local_90 = MRIStepCreate(0,fs,0,plVar3,local_80,local_88);
      if (local_90 == 0) {
        main_cold_1();
        return 1;
      }
      uVar2 = ARKodeSetUserData(local_90,&local_48);
      if ((int)uVar2 < 0) goto LAB_00101701;
      uVar2 = ARKodeSetFixedStep(0x3f9999999999999a,local_90);
      if (-1 < (int)uVar2) {
        __s = fopen("ark_brusselator_mri_solution.txt","w");
        fwrite("# t u v w\n",10,1,__s);
        puVar1 = *(undefined8 **)(*plVar3 + 0x10);
        fprintf(__s," %.16e %.16e %.16e %.16e\n",0,*puVar1,puVar1[1],puVar1[2]);
        local_78 = 0;
        puts("        t           u           v           w");
        puts("   ----------------------------------------------");
        puVar1 = *(undefined8 **)(*plVar3 + 0x10);
        printf("  %10.6f  %10.6f  %10.6f  %10.6f\n",local_78,*puVar1,puVar1[1],puVar1[2]);
        dVar6 = 0.1;
        iVar5 = 0x14;
        do {
          local_70 = dVar6;
          uVar2 = ARKodeEvolve(local_90,plVar3,&local_78,1);
          if ((int)uVar2 < 0) {
            fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n","ARKodeEvolve",
                    (ulong)uVar2);
            break;
          }
          puVar1 = *(undefined8 **)(*plVar3 + 0x10);
          printf("  %10.6f  %10.6f  %10.6f  %10.6f\n",local_78,*puVar1,puVar1[1],puVar1[2]);
          puVar1 = *(undefined8 **)(*plVar3 + 0x10);
          fprintf(__s," %.16e %.16e %.16e %.16e\n",local_78,*puVar1,puVar1[1],puVar1[2]);
          dVar6 = 2.0;
          if (local_70 + 0.1 <= 2.0) {
            dVar6 = local_70 + 0.1;
          }
          iVar5 = iVar5 + -1;
        } while (iVar5 != 0);
        puts("   ----------------------------------------------");
        fclose(__s);
        uVar2 = ARKodeGetNumSteps(local_90,&local_50);
        if ((int)uVar2 < 0) {
          fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n","ARKodeGetNumSteps",
                  (ulong)uVar2);
        }
        uVar2 = ARKodeGetNumRhsEvals(local_90,0,&local_60);
        if ((int)uVar2 < 0) {
          fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",
                  "ARKodeGetNumRhsEvals",(ulong)uVar2);
        }
        uVar2 = ARKodeGetNumSteps(local_98,&local_58);
        if ((int)uVar2 < 0) {
          fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n","ARKodeGetNumSteps",
                  (ulong)uVar2);
        }
        uVar2 = ARKodeGetNumRhsEvals(local_98,0,&local_68);
        if ((int)uVar2 < 0) {
          fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",
                  "ARKodeGetNumRhsEvals",(ulong)uVar2);
        }
        puts("\nFinal Solver Statistics:");
        printf("   Steps: nsts = %li, nstf = %li\n",local_50,local_58);
        printf("   Total RHS evals:  Fs = %li,  Ff = %li\n",local_60,local_68);
        N_VDestroy(plVar3);
        ARKodeFree(&local_98);
        MRIStepInnerStepper_Free(&local_80);
        ARKodeFree(&local_90);
        SUNContext_Free(&local_88);
        return 0;
      }
    }
    pcVar4 = "ARKodeSetFixedStep";
  }
LAB_0010178f:
  fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",pcVar4,(ulong)uVar2);
  return 1;
}

Assistant:

int main(void)
{
  /* general problem parameters */
  sunrealtype T0    = SUN_RCONST(0.0);       /* initial time */
  sunrealtype Tf    = SUN_RCONST(2.0);       /* final time */
  sunrealtype dTout = SUN_RCONST(0.1);       /* time between outputs */
  sunindextype NEQ  = 3;                     /* number of dependent vars. */
  int Nt            = (int)ceil(Tf / dTout); /* number of output times */
  sunrealtype hs    = SUN_RCONST(0.025);     /* slow step size */
  sunrealtype hf    = SUN_RCONST(0.001);     /* fast step size */
  sunrealtype a, b, ep;                      /* ODE parameters */
  sunrealtype u0, v0, w0;                    /* initial conditions */
  sunrealtype rdata[3];                      /* user data */

  /* general problem variables */
  int retval;                    /* reusable error-checking flag */
  N_Vector y             = NULL; /* empty vector for storing solution */
  void* arkode_mem       = NULL; /* empty ARKode memory structure */
  void* inner_arkode_mem = NULL; /* empty ARKode memory structure */
  MRIStepInnerStepper inner_stepper = NULL; /* inner stepper */
  FILE* UFID;
  sunrealtype t, tout;
  int iout;
  long int nsts, nstf, nfse, nff;

  /*
   * Initialization
   */

  /* Create the SUNDIALS context object for this simulation */
  SUNContext ctx;
  retval = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return 1; }

  /* Set up the test problem parameters */
  a  = SUN_RCONST(1.0);
  b  = SUN_RCONST(3.5);
  ep = SUN_RCONST(1.0e-2);

  /* Set the initial contions */
  u0 = SUN_RCONST(1.2);
  v0 = SUN_RCONST(3.1);
  w0 = SUN_RCONST(3.0);

  /* Initial problem output */
  printf("\nBrusselator ODE test problem:\n");
  printf("    initial conditions:  u0 = %" GSYM ",  v0 = %" GSYM
         ",  w0 = %" GSYM "\n",
         u0, v0, w0);
  printf("    problem parameters:  a = %" GSYM ",  b = %" GSYM ",  ep = %" GSYM
         "\n",
         a, b, ep);
  printf("    hs = %" GSYM ",  hf = %" GSYM "\n\n", hs, hf);

  /* Set parameters in user data */
  rdata[0] = a;
  rdata[1] = b;
  rdata[2] = ep;

  /* Create and initialize serial vector for the solution */
  y = N_VNew_Serial(NEQ, ctx);
  if (check_retval((void*)y, "N_VNew_Serial", 0)) { return 1; }
  NV_Ith_S(y, 0) = u0;
  NV_Ith_S(y, 1) = v0;
  NV_Ith_S(y, 2) = w0;

  /*
   * Create the fast integrator and set options
   */

  /* Initialize the fast integrator. Specify the explicit fast right-hand side
     function in y'=fe(t,y)+fi(t,y)+ff(t,y), the initial time T0, and the
     initial dependent variable vector y. */
  inner_arkode_mem = ARKStepCreate(ff, NULL, T0, y, ctx);
  if (check_retval((void*)inner_arkode_mem, "ARKStepCreate", 0)) { return 1; }

  /* Attach user data to fast integrator */
  retval = ARKodeSetUserData(inner_arkode_mem, (void*)rdata);
  if (check_retval(&retval, "ARKodeSetUserData", 1)) { return 1; }

  /* Set the fast method */
  retval = ARKStepSetTableNum(inner_arkode_mem, -1, ARKODE_KNOTH_WOLKE_3_3);
  if (check_retval(&retval, "ARKStepSetTableNum", 1)) { return 1; }

  /* Set the fast step size */
  retval = ARKodeSetFixedStep(inner_arkode_mem, hf);
  if (check_retval(&retval, "ARKodeSetFixedStep", 1)) { return 1; }

  /* Create inner stepper */
  retval = ARKodeCreateMRIStepInnerStepper(inner_arkode_mem, &inner_stepper);
  if (check_retval(&retval, "ARKodeCreateMRIStepInnerStepper", 1)) { return 1; }

  /*
   * Create the slow integrator and set options
   */

  /* Initialize the slow integrator. Specify the explicit slow right-hand side
     function in y'=fe(t,y)+fi(t,y)+ff(t,y), the initial time T0, the
     initial dependent variable vector y, and the fast integrator. */
  arkode_mem = MRIStepCreate(fs, NULL, T0, y, inner_stepper, ctx);
  if (check_retval((void*)arkode_mem, "MRIStepCreate", 0)) { return 1; }

  /* Pass rdata to user functions */
  retval = ARKodeSetUserData(arkode_mem, (void*)rdata);
  if (check_retval(&retval, "ARKodeSetUserData", 1)) { return 1; }

  /* Set the slow step size */
  retval = ARKodeSetFixedStep(arkode_mem, hs);
  if (check_retval(&retval, "ARKodeSetFixedStep", 1)) { return 1; }

  /*
   * Integrate ODE
   */

  /* Open output stream for results, output comment line */
  UFID = fopen("ark_brusselator_mri_solution.txt", "w");
  fprintf(UFID, "# t u v w\n");

  /* output initial condition to disk */
  fprintf(UFID, " %.16" ESYM " %.16" ESYM " %.16" ESYM " %.16" ESYM "\n", T0,
          NV_Ith_S(y, 0), NV_Ith_S(y, 1), NV_Ith_S(y, 2));

  /* Main time-stepping loop: calls ARKodeEvolve to perform the
     integration, then prints results. Stops when the final time
     has been reached */
  t    = T0;
  tout = T0 + dTout;
  printf("        t           u           v           w\n");
  printf("   ----------------------------------------------\n");
  printf("  %10.6" FSYM "  %10.6" FSYM "  %10.6" FSYM "  %10.6" FSYM "\n", t,
         NV_Ith_S(y, 0), NV_Ith_S(y, 1), NV_Ith_S(y, 2));

  for (iout = 0; iout < Nt; iout++)
  {
    /* call integrator */
    retval = ARKodeEvolve(arkode_mem, tout, y, &t, ARK_NORMAL);
    if (check_retval(&retval, "ARKodeEvolve", 1)) { break; }

    /* access/print solution */
    printf("  %10.6" FSYM "  %10.6" FSYM "  %10.6" FSYM "  %10.6" FSYM "\n", t,
           NV_Ith_S(y, 0), NV_Ith_S(y, 1), NV_Ith_S(y, 2));
    fprintf(UFID, " %.16" ESYM " %.16" ESYM " %.16" ESYM " %.16" ESYM "\n", t,
            NV_Ith_S(y, 0), NV_Ith_S(y, 1), NV_Ith_S(y, 2));

    /* successful solve: update time */
    tout += dTout;
    tout = (tout > Tf) ? Tf : tout;
  }
  printf("   ----------------------------------------------\n");
  fclose(UFID);

  /*
   * Finalize
   */

  /* Get some slow integrator statistics */
  retval = ARKodeGetNumSteps(arkode_mem, &nsts);
  check_retval(&retval, "ARKodeGetNumSteps", 1);
  retval = ARKodeGetNumRhsEvals(arkode_mem, 0, &nfse);
  check_retval(&retval, "ARKodeGetNumRhsEvals", 1);

  /* Get some fast integrator statistics */
  retval = ARKodeGetNumSteps(inner_arkode_mem, &nstf);
  check_retval(&retval, "ARKodeGetNumSteps", 1);
  retval = ARKodeGetNumRhsEvals(inner_arkode_mem, 0, &nff);
  check_retval(&retval, "ARKodeGetNumRhsEvals", 1);

  /* Print some final statistics */
  printf("\nFinal Solver Statistics:\n");
  printf("   Steps: nsts = %li, nstf = %li\n", nsts, nstf);
  printf("   Total RHS evals:  Fs = %li,  Ff = %li\n", nfse, nff);

  /* Clean up and return */
  N_VDestroy(y);                            /* Free y vector */
  ARKodeFree(&inner_arkode_mem);            /* Free integrator memory */
  MRIStepInnerStepper_Free(&inner_stepper); /* Free inner stepper */
  ARKodeFree(&arkode_mem);                  /* Free integrator memory */
  SUNContext_Free(&ctx);                    /* Free context */

  return 0;
}